

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

void __thiscall
CLIntercept::addSubDeviceInfo
          (CLIntercept *this,cl_device_id parentDevice,cl_device_id *devices,cl_uint numSubDevices)

{
  mapped_type *pmVar1;
  iterator iVar2;
  ulong uVar3;
  float __x;
  cl_device_id device;
  cl_device_id local_50;
  CLIntercept *local_48;
  cl_device_id local_40;
  CSubDeviceInfoMap *local_38;
  
  local_40 = parentDevice;
  std::mutex::lock(&this->m_Mutex);
  local_38 = &this->m_SubDeviceInfoMap;
  local_48 = this;
  for (uVar3 = (ulong)numSubDevices; uVar3 != 0; uVar3 = uVar3 - 1) {
    local_50 = devices[uVar3 - 1 & 0xffffffff];
    if (local_50 != (cl_device_id)0x0) {
      pmVar1 = std::
               map<_cl_device_id_*,_CLIntercept::SSubDeviceInfo,_std::less<_cl_device_id_*>,_std::allocator<std::pair<_cl_device_id_*const,_CLIntercept::SSubDeviceInfo>_>_>
               ::operator[](local_38,&local_50);
      pmVar1->ParentDevice = local_40;
      pmVar1->SubDeviceIndex = (cl_uint)(uVar3 - 1);
      iVar2 = std::
              _Rb_tree<_cl_device_id_*,_std::pair<_cl_device_id_*const,_CLIntercept::SDeviceInfo>,_std::_Select1st<std::pair<_cl_device_id_*const,_CLIntercept::SDeviceInfo>_>,_std::less<_cl_device_id_*>,_std::allocator<std::pair<_cl_device_id_*const,_CLIntercept::SDeviceInfo>_>_>
              ::find(&(this->m_DeviceInfoMap)._M_t,&local_50);
      if ((_Rb_tree_header *)iVar2._M_node !=
          &(this->m_DeviceInfoMap)._M_t._M_impl.super__Rb_tree_header) {
        logf(local_48,__x);
      }
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
  return;
}

Assistant:

void CLIntercept::addSubDeviceInfo(
    const cl_device_id parentDevice,
    const cl_device_id* devices,
    cl_uint numSubDevices )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    while( numSubDevices-- )
    {
        cl_device_id    device = devices[ numSubDevices ];
        if( device )
        {
            SSubDeviceInfo& subDeviceInfo = m_SubDeviceInfoMap[ device ];

            subDeviceInfo.ParentDevice = parentDevice;
            subDeviceInfo.SubDeviceIndex = numSubDevices;

            // Currently, information about a device is assumed to be
            // invariant, though for sub-device handles the information
            // about a device can change if sub-device handles are recycled.
            // Since this is expected to occur rarely, for now simply log a
            // warning if this occurs.
            if( m_DeviceInfoMap.find(device) != m_DeviceInfoMap.end() )
            {
                logf( "Warning: found a recycled sub-device handle %p!\n",
                    device );
            }
        }
    }
}